

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

bool __thiscall
llbuild::buildsystem::BuildSystem::loadDescription(BuildSystem *this,StringRef mainFilename)

{
  void *pvVar1;
  BuildDescription *__ptr;
  undefined8 uVar2;
  undefined8 uVar3;
  BuildFile BVar4;
  char *pcVar5;
  pointer __p;
  BuildFile local_60;
  Child local_58;
  undefined8 local_50;
  NodeKind local_48;
  undefined7 uStack_47;
  undefined8 local_38;
  undefined4 local_30;
  
  pcVar5 = mainFilename.Data;
  pvVar1 = this->impl;
  local_58.twine = (Twine *)&local_48;
  if (pcVar5 == (char *)0x0) {
    local_50 = 0;
    local_48 = NullKind;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,pcVar5,pcVar5 + mainFilename.Length);
  }
  std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x18),(string *)&local_58.character);
  if (local_58.twine != (Twine *)&local_48) {
    operator_delete(local_58.twine,CONCAT71(uStack_47,local_48) + 1);
  }
  BuildFile::BuildFile
            ((BuildFile *)&local_58,mainFilename,(BuildFileDelegate *)((long)pvVar1 + 0x38));
  BuildFile::load(&local_60);
  BuildFile::~BuildFile((BuildFile *)&local_58);
  BVar4.impl = local_60.impl;
  if ((BuildDescription *)local_60.impl == (BuildDescription *)0x0) {
    uVar2 = *(undefined8 *)((long)pvVar1 + 0x18);
    uVar3 = *(undefined8 *)((long)pvVar1 + 0x20);
    llvm::Twine::Twine((Twine *)&local_58,"unable to load build file");
    local_38 = 0;
    local_30 = 0;
    (**(code **)(**(long **)((long)pvVar1 + 8) + 0x18))
              (*(long **)((long)pvVar1 + 8),uVar2,uVar3,&local_38,&local_58);
  }
  else {
    local_60.impl = (BuildDescription *)0x0;
    __ptr = *(BuildDescription **)((long)pvVar1 + 0x68);
    *(void **)((long)pvVar1 + 0x68) = BVar4.impl;
    if (__ptr == (BuildDescription *)0x0) goto LAB_001599a7;
    std::default_delete<llbuild::buildsystem::BuildDescription>::operator()
              ((default_delete<llbuild::buildsystem::BuildDescription> *)((long)pvVar1 + 0x68),__ptr
              );
  }
  if ((BuildDescription *)local_60.impl != (BuildDescription *)0x0) {
    std::default_delete<llbuild::buildsystem::BuildDescription>::operator()
              ((default_delete<llbuild::buildsystem::BuildDescription> *)&local_60,
               (BuildDescription *)local_60.impl);
  }
LAB_001599a7:
  return (BuildDescription *)BVar4.impl != (BuildDescription *)0x0;
}

Assistant:

bool BuildSystem::loadDescription(StringRef mainFilename) {
  return static_cast<BuildSystemImpl*>(impl)->loadDescription(mainFilename);
}